

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  uint __c;
  char *pcVar2;
  bool bVar3;
  char *local_30;
  char *opt_ptr;
  int c;
  char *optstr_local;
  char **argv_local;
  int argc_local;
  
  if ((prev_argv != ___argv) || (prev_argc != ___argc)) {
    argv_index = 1;
    argv_index2 = 1;
    opt_offset = 1;
    dashdash = 0;
    nonopt = 0;
    prev_argv = ___argv;
    prev_argc = ___argc;
  }
  while( true ) {
    optarg = (char *)0x0;
    if ((___argv[argv_index] != (char *)0x0) &&
       (iVar1 = strcmp(___argv[argv_index],"--"), iVar1 == 0)) {
      dashdash = 1;
      increment_index();
    }
    if (___argv[argv_index] == (char *)0x0) {
      opt_ptr._4_4_ = 0xffffffff;
      goto LAB_00107584;
    }
    if (((dashdash == 0) && (*___argv[argv_index] == '-')) &&
       (iVar1 = strcmp(___argv[argv_index],"-"), iVar1 != 0)) {
      __c = (uint)___argv[argv_index][opt_offset];
      if (*__shortopts == '-') {
        opt_offset = opt_offset + 1;
        local_30 = strchr(__shortopts + 1,__c);
      }
      else {
        opt_offset = opt_offset + 1;
        local_30 = strchr(__shortopts,__c);
      }
      if (local_30 == (char *)0x0) {
        if (opterr != 0) {
          fprintf(_stderr,"%s: invalid option -- %c\n",*___argv,(ulong)__c);
        }
        opt_ptr._4_4_ = 0x3f;
        optopt = __c;
        increment_index();
      }
      else {
        opt_ptr._4_4_ = __c;
        if (local_30[1] == ':') {
          if (___argv[argv_index][opt_offset] == '\0') {
            if (local_30[2] == ':') {
              increment_index();
            }
            else {
              if (argv_index2 < argv_index) {
                argv_index2 = argv_index;
              }
              do {
                argv_index2 = argv_index2 + 1;
                bVar3 = false;
                if (___argv[argv_index2] != (char *)0x0) {
                  bVar3 = *___argv[argv_index2] == '-';
                }
              } while (bVar3);
              optarg = ___argv[argv_index2];
              if (prev_argc <= argv_index2 + nonopt) {
                optarg = (char *)0x0;
              }
              increment_index();
            }
          }
          else {
            optarg = ___argv[argv_index] + opt_offset;
            increment_index();
          }
          if (((optarg == (char *)0x0) && (local_30[2] != ':')) &&
             (opt_ptr._4_4_ = 0x3f, optopt = __c, opterr != 0)) {
            fprintf(_stderr,"%s: option requires an argument -- %c\n",*___argv,(ulong)__c);
          }
        }
        else if (___argv[argv_index][opt_offset] == '\0') {
          increment_index();
        }
      }
      goto LAB_00107584;
    }
    if (*__shortopts == '-') {
      opt_ptr._4_4_ = 1;
      optarg = ___argv[argv_index];
      increment_index();
      goto LAB_00107584;
    }
    if ((*__shortopts == '+') || (pcVar2 = getenv("POSIXLY_CORRECT"), pcVar2 != (char *)0x0)) break;
    iVar1 = permute_argv_once();
    if (iVar1 != 0) {
LAB_00107336:
      opt_ptr._4_4_ = 0xffffffff;
LAB_00107584:
      if (opt_ptr._4_4_ == 0xffffffff) {
        optind = ___argc - nonopt;
      }
      else {
        optind = argv_index;
      }
      return opt_ptr._4_4_;
    }
  }
  nonopt = ___argc - argv_index;
  goto LAB_00107336;
}

Assistant:

int getopt(int argc, char** argv, const char* optstr)
{
	int c = 0;

	/* If we have new argv, reinitialize */
	if(prev_argv != argv || prev_argc != argc)
	{
		/* Initialize variables */
		prev_argv = argv;
		prev_argc = argc;
		argv_index = 1;
		argv_index2 = 1;
		opt_offset = 1;
		dashdash = 0;
		nonopt = 0;
	}

	/* Jump point in case we want to ignore the current argv_index */
	getopt_top:

	/* Misc. initializations */
	optarg = NULL;

	/* Dash-dash check */
	if(argv[argv_index] && !strcmp(argv[argv_index], "--"))
	{
		dashdash = 1;
		increment_index();
	}

	/* If we're at the end of argv, that's it. */
	if(argv[argv_index] == NULL)
	{
		c = -1;
	}
	/* Are we looking at a string? Single dash is also a string */
	else if(dashdash || argv[argv_index][0] != '-' || !strcmp(argv[argv_index], "-"))
	{
		/* If we want a string... */
		if(optstr[0] == '-')
		{
			c = 1;
			optarg = argv[argv_index];
			increment_index();
		}
		/* If we really don't want it (we're in POSIX mode), we're done */
		else if(optstr[0] == '+' || getenv("POSIXLY_CORRECT"))
		{
			c = -1;

			/* Everything else is a non-opt argument */
			nonopt = argc - argv_index;
		}
		/* If we mildly don't want it, then move it back */
		else
		{
			if(!permute_argv_once()) goto getopt_top;
			else c = -1;
		}
	}
	/* Otherwise we're looking at an option */
	else
	{
		char* opt_ptr = NULL;

		/* Grab the option */
		c = argv[argv_index][opt_offset++];

		/* Is the option in the optstr? */
		if(optstr[0] == '-') opt_ptr = strchr(optstr+1, c);
		else opt_ptr = strchr(optstr, c);
		/* Invalid argument */
		if(!opt_ptr)
		{
			if(opterr)
			{
				fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
			}

			optopt = c;
			c = '?';

			/* Move onto the next option */
			increment_index();
		}
		/* Option takes argument */
		else if(opt_ptr[1] == ':')
		{
			/* ie, -oARGUMENT, -xxxoARGUMENT, etc. */
			if(argv[argv_index][opt_offset] != '\0')
			{
				optarg = &argv[argv_index][opt_offset];
				increment_index();
			}
			/* ie, -o ARGUMENT (only if it's a required argument) */
			else if(opt_ptr[2] != ':')
			{
				/* One of those "you're not expected to understand this" moment */
				if(argv_index2 < argv_index) argv_index2 = argv_index;
				while(argv[++argv_index2] && argv[argv_index2][0] == '-');
				optarg = argv[argv_index2];

				/* Don't cross into the non-option argument list */
				if(argv_index2 + nonopt >= prev_argc) optarg = NULL;

				/* Move onto the next option */
				increment_index();
			}
			else
			{
				/* Move onto the next option */
				increment_index();
			}

			/* In case we got no argument for an option with required argument */
			if(optarg == NULL && opt_ptr[2] != ':')
			{
				optopt = c;
				c = '?';

				if(opterr)
				{
					fprintf(stderr,"%s: option requires an argument -- %c\n",
							argv[0], optopt);
				}
			}
		}
		/* Option does not take argument */
		else
		{
			/* Next argv_index */
			if(argv[argv_index][opt_offset] == '\0')
			{
				increment_index();
			}
		}
	}

	/* Calculate optind */
	if(c == -1)
	{
		optind = argc - nonopt;
	}
	else
	{
		optind = argv_index;
	}

	return c;
}